

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O1

from_chars_result_t<char> __thiscall
fast_float::from_chars_advanced<double,char>
          (fast_float *this,char *first,char *last,double *value,parse_options_t<char> options)

{
  fast_float fVar1;
  fast_float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  from_chars_result_t<char> fVar19;
  from_chars_result_t<char> fVar20;
  from_chars_result_t<char> fVar21;
  from_chars_result_t<char> fVar22;
  int iVar23;
  size_t sVar24;
  long lVar25;
  byte bVar26;
  undefined4 uVar27;
  bigint *pbVar28;
  ulong uVar29;
  undefined4 uVar30;
  fast_float *pfVar31;
  fast_float *pfVar32;
  fast_float *pfVar33;
  chars_format exponent_00;
  ulong uVar34;
  fast_float fVar35;
  ulong uVar36;
  size_t sVar37;
  long lVar38;
  uint uVar39;
  fast_float *pfVar40;
  ulong uVar41;
  fast_float *pfVar42;
  ulong uVar43;
  bigint *bigmant_00;
  fast_float *pfVar44;
  int32_t exponent;
  uint uVar45;
  int iVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  from_chars_result_t<char> fVar50;
  adjusted_mantissa aVar51;
  parsed_number_string_t<char> answer;
  size_t digits;
  bigint bigmant;
  parsed_number_string_t<char> local_288;
  fast_float *local_248;
  double *local_240;
  fast_float *local_238;
  size_t local_230;
  bigint local_228;
  
  if (this == (fast_float *)first) {
    fVar50._8_8_ = 0x16;
    fVar50.ptr = (char *)this;
    return fVar50;
  }
  local_288.fraction.ptr = (char *)0x0;
  local_288.fraction.length = 0;
  local_288.integer.ptr = (char *)0x0;
  local_288.integer.length = 0;
  local_288.exponent = 0;
  local_288.mantissa._0_3_ = 0;
  local_288.mantissa._3_5_ = 0;
  local_288.lastmatch._0_3_ = 0;
  local_288.lastmatch._3_5_ = 0;
  local_288.valid = false;
  local_288.too_many_digits = false;
  fVar1 = *this;
  local_288.negative = fVar1 == (fast_float)0x2d;
  fVar35 = SUB81((ulong)value >> 0x20,0);
  pfVar31 = this;
  if ((!local_288.negative) ||
     ((pfVar31 = this + 1, pfVar31 != (fast_float *)first &&
      (*pfVar31 == fVar35 || (byte)((char)*pfVar31 - 0x30U) < 10)))) {
    fVar2 = *pfVar31;
    if ((byte)((char)fVar2 - 0x30U) < 10) {
      options.format = 0;
      options.decimal_point = '\0';
      options._5_3_ = 0;
      pfVar32 = pfVar31;
      do {
        pfVar32 = pfVar32 + 1;
        options = (parse_options_t<char>)(((ulong)(byte)fVar2 + (long)options * 10) - 0x30);
        bVar47 = pfVar32 == (fast_float *)first;
        pfVar33 = (fast_float *)first;
        if (bVar47) break;
        fVar2 = *pfVar32;
        pfVar33 = pfVar32;
      } while ((byte)((char)fVar2 - 0x30U) < 10);
    }
    else {
      options.format = 0;
      options.decimal_point = '\0';
      options._5_3_ = 0;
      bVar47 = false;
      pfVar33 = pfVar31;
    }
    local_288.integer.length = (long)pfVar33 - (long)pfVar31;
    if ((bVar47) || (*pfVar33 != fVar35)) {
      pfVar44 = (fast_float *)0x0;
      sVar37 = local_288.integer.length;
      pfVar32 = pfVar33;
    }
    else {
      local_288.fraction.ptr = (char *)(pfVar33 + 1);
      lVar38 = (long)first - (long)local_288.fraction.ptr;
      pfVar44 = (fast_float *)local_288.fraction.ptr;
      while ((pfVar32 = pfVar44, 7 < lVar38 &&
             (uVar43 = *(long *)pfVar44 + 0xcfcfcfcfcfcfcfd0,
             ((*(long *)pfVar44 + 0x4646464646464646U | uVar43) & 0x8080808080808080) == 0))) {
        uVar43 = uVar43 * 10 + (uVar43 >> 8);
        options = (parse_options_t<char>)
                  (((uVar43 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar43 & 0xff000000ff) * 0xf424000000064 >> 0x20) + (long)options * 100000000);
        pfVar44 = pfVar44 + 8;
        lVar38 = lVar38 + -8;
      }
      for (; (pfVar44 != (fast_float *)first &&
             (pfVar32 = pfVar44, (byte)((char)*pfVar44 - 0x30U) < 10)); pfVar44 = pfVar44 + 1) {
        options = (parse_options_t<char>)
                  ((ulong)(byte)((char)*pfVar44 - 0x30U) + (long)options * 10);
        pfVar32 = (fast_float *)first;
      }
      pfVar44 = (fast_float *)local_288.fraction.ptr + -(long)pfVar32;
      local_288.fraction.length = (long)pfVar32 - (long)local_288.fraction.ptr;
      sVar37 = local_288.integer.length - (long)pfVar44;
      local_248 = (fast_float *)local_288.fraction.ptr;
      local_240 = value;
      local_238 = this;
    }
    local_288.integer.ptr = (char *)pfVar31;
    if (sVar37 != 0) {
      if (((ulong)value & 1) == 0) {
LAB_0039fd53:
        lVar38 = 0;
      }
      else {
        if ((pfVar32 == (fast_float *)first) || (((byte)*pfVar32 | 0x20) != 0x65)) {
          if (((ulong)value & 4) == 0) goto LAB_0039fedd;
          goto LAB_0039fd53;
        }
        pfVar40 = pfVar32 + 1;
        if (pfVar40 == (fast_float *)first) {
LAB_0039fe60:
          bVar47 = false;
        }
        else {
          if (*pfVar40 != (fast_float)0x2d) {
            if ((pfVar40 != (fast_float *)first) && (pfVar32[1] == (fast_float)0x2b)) {
              pfVar40 = pfVar32 + 2;
            }
            goto LAB_0039fe60;
          }
          pfVar40 = pfVar32 + 2;
          bVar47 = true;
        }
        pfVar42 = pfVar40;
        if ((pfVar40 == (fast_float *)first) || (9 < (byte)((char)*pfVar40 - 0x30U))) {
          bVar26 = (byte)((ulong)value >> 2) & 1;
          if (((ulong)value >> 2 & 1) != 0) {
            pfVar42 = pfVar32;
          }
          lVar38 = 0;
        }
        else {
          if (pfVar40 == (fast_float *)first) {
            lVar25 = 0;
          }
          else {
            lVar25 = 0;
            do {
              pfVar42 = pfVar40;
              if (9 < (byte)((char)*pfVar40 - 0x30U)) break;
              if (lVar25 < 0x10000000) {
                lVar25 = (ulong)(byte)((char)*pfVar40 - 0x30U) + lVar25 * 10;
              }
              pfVar40 = pfVar40 + 1;
              pfVar42 = (fast_float *)first;
            } while (pfVar40 != (fast_float *)first);
          }
          lVar38 = -lVar25;
          if (!bVar47) {
            lVar38 = lVar25;
          }
          pfVar44 = pfVar44 + lVar38;
          bVar26 = 1;
        }
        pfVar32 = pfVar42;
        if (bVar26 == 0) goto LAB_0039fedd;
      }
      local_288.lastmatch._0_3_ = SUB83(pfVar32,0);
      local_288.lastmatch._3_5_ = (undefined5)((ulong)pfVar32 >> 0x18);
      local_288.valid = true;
      pfVar32 = pfVar31;
      if (0x13 < (long)sVar37) {
        do {
          fVar2 = *pfVar32;
          if (fVar2 != fVar35 && fVar2 != (fast_float)0x30) break;
          sVar37 = sVar37 - (fVar2 == (fast_float)0x30);
          pfVar32 = pfVar32 + 1;
        } while (pfVar32 != (fast_float *)first);
        if (0x13 < (long)sVar37) {
          local_288.too_many_digits = true;
          pfVar32 = (fast_float *)local_288.fraction.ptr;
          sVar37 = local_288.fraction.length;
          if (local_288.integer.length == 0) {
            options.format = 0;
            options.decimal_point = '\0';
            options._5_3_ = 0;
          }
          else {
            options.format = 0;
            options.decimal_point = '\0';
            options._5_3_ = 0;
            sVar24 = local_288.integer.length;
            do {
              sVar24 = sVar24 - 1;
              options = (parse_options_t<char>)((long)(char)*pfVar31 + (long)options * 10 + -0x30);
              pfVar31 = pfVar31 + 1;
              if (999999999999999999 < (ulong)options) break;
            } while (sVar24 != 0);
          }
          for (; ((ulong)options < 1000000000000000000 &&
                 (pfVar31 = pfVar32, pfVar33 = (fast_float *)local_288.fraction.ptr, sVar37 != 0));
              sVar37 = sVar37 - 1) {
            options = (parse_options_t<char>)(((long)(char)*pfVar32 + (long)options * 10) - 0x30);
            pfVar31 = pfVar32 + 1;
            pfVar32 = pfVar32 + 1;
          }
          pfVar44 = pfVar33 + (lVar38 - (long)pfVar31);
        }
      }
      local_288.mantissa._0_3_ = (undefined3)options.format;
      local_288.mantissa._3_5_ = options._3_5_;
      local_288.exponent = (int64_t)pfVar44;
    }
  }
LAB_0039fedd:
  if (local_288.valid == false) {
    fVar50 = detail::parse_infnan<double,char>((char *)this,first,(double *)last);
    return fVar50;
  }
  uVar43 = CONCAT53(local_288.lastmatch._3_5_,local_288.lastmatch._0_3_);
  if (((fast_float *)0xffffffffffffffd2 < (fast_float *)(local_288.exponent + -0x17)) &&
     (local_288.too_many_digits == false)) {
    uVar27 = (undefined4)((uint5)local_288.mantissa._3_5_ >> 8);
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < local_288.exponent) &&
         (uVar29 = CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa),
         uVar29 <= *(ulong *)(binary_format_lookup_tables<double,void>::max_mantissa +
                             local_288.exponent * 8))) {
        if (uVar29 == 0) {
          if (fVar1 == (fast_float)0x2d) {
            uVar45 = 0x80000000;
          }
          else {
            uVar45 = 0;
          }
          *(ulong *)last = (ulong)uVar45 << 0x20;
          fVar22._8_8_ = 0;
          fVar22.ptr = (char *)uVar43;
          return fVar22;
        }
        auVar49._8_4_ = uVar27;
        auVar49._0_8_ = uVar29;
        auVar49._12_4_ = 0x45300000;
        dVar15 = ((auVar49._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0)) *
                 *(double *)
                  (binary_format_lookup_tables<double,void>::powers_of_ten + local_288.exponent * 8)
        ;
        goto LAB_003a04bd;
      }
    }
    else {
      uVar29 = CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa);
      if (uVar29 < 0x20000000000001) {
        auVar48._8_4_ = uVar27;
        auVar48._0_8_ = uVar29;
        auVar48._12_4_ = 0x45300000;
        dVar15 = (auVar48._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0);
        *(double *)last = dVar15;
        if (local_288.exponent < 0) {
          dVar15 = dVar15 / *(double *)
                             (binary_format_lookup_tables<double,void>::powers_of_ten +
                             local_288.exponent * -8);
        }
        else {
          dVar15 = dVar15 * *(double *)
                             (binary_format_lookup_tables<double,void>::powers_of_ten +
                             local_288.exponent * 8);
        }
LAB_003a04bd:
        fVar21._8_8_ = 0;
        fVar21.ptr = (char *)uVar43;
        fVar20._8_8_ = 0;
        fVar20.ptr = (char *)uVar43;
        *(double *)last = dVar15;
        if (fVar1 != (fast_float)0x2d) {
          return fVar20;
        }
        *(double *)last = -dVar15;
        return fVar21;
      }
    }
  }
  uVar29 = CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa);
  iVar46 = (int)local_288.exponent;
  if (local_288.exponent < -0x156 || uVar29 == 0) {
LAB_0039ffcf:
    uVar41 = 0;
LAB_0039ffe3:
    bigmant_00 = (bigint *)0x0;
  }
  else {
    if (0x134 < local_288.exponent) {
      uVar41 = 0x7ff;
      goto LAB_0039ffe3;
    }
    uVar41 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar41 == 0; uVar41 = uVar41 - 1) {
      }
    }
    uVar36 = uVar29 << ((byte)(uVar41 ^ 0x3f) & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar36;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar46 * 2 + 0x2ac) * 8);
    auVar3 = auVar3 * auVar9;
    if ((~auVar3._8_4_ & 0x1ff) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar36;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = SUB168(auVar4 * auVar10,8);
      auVar3 = auVar3 + auVar16;
    }
    options = auVar3._8_8_;
    iVar23 = (((iVar46 * 0x3526a >> 0x10) - (int)(uVar41 ^ 0x3f)) - (auVar3._12_4_ >> 0x1f)) + 0x43e
    ;
    bVar26 = 9 - (auVar3[0xf] >> 7);
    uVar41 = (ulong)options >> (bVar26 & 0x3f);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) goto LAB_0039ffcf;
      bVar26 = 1 - (char)iVar23;
      uVar36 = (uVar41 >> (bVar26 & 0x3f)) + (ulong)((uVar41 >> ((ulong)bVar26 & 0x3f) & 1) != 0);
      uVar41 = (ulong)(uVar36 >> 0x35 != 0);
      bigmant_00 = (bigint *)(uVar36 >> 1);
    }
    else {
      uVar36 = uVar41 & 0xfffffffffffffe;
      if ((parse_options_t<char>)(uVar41 << (bVar26 & 0x3f)) != options || ((uint)uVar41 & 3) != 1)
      {
        uVar36 = uVar41;
      }
      if (1 < auVar3._0_8_) {
        uVar36 = uVar41;
      }
      if ((fast_float *)0x1b < (fast_float *)(local_288.exponent + 4)) {
        uVar36 = uVar41;
      }
      uVar41 = (ulong)((uint)uVar36 & 1);
      bVar47 = uVar41 + uVar36 >> 0x36 != 0;
      bigmant_00 = (bigint *)((uVar36 >> 1) + (uVar41 & uVar36) & 0x7fefffffffffffff);
      if (bVar47) {
        bigmant_00 = (bigint *)0x0;
      }
      uVar39 = iVar23 + (uint)bVar47;
      uVar45 = uVar39;
      if (0x7fe < (int)uVar39) {
        uVar45 = 0x7ff;
      }
      uVar41 = (ulong)uVar45;
      if (0x7fe < (int)uVar39) {
        bigmant_00 = (bigint *)0x0;
      }
    }
  }
  if ((local_288.too_many_digits != true) || ((int)(uint)uVar41 < 0)) goto LAB_003a01d0;
  uVar36 = uVar29 + 1;
  if (local_288.exponent < -0x156 || uVar36 == 0) {
LAB_003a0015:
    uVar45 = 0;
LAB_003a013e:
    pbVar28 = (bigint *)0x0;
  }
  else {
    if (0x134 < local_288.exponent) {
      uVar45 = 0x7ff;
      goto LAB_003a013e;
    }
    uVar34 = 0x3f;
    if (uVar36 != 0) {
      for (; uVar36 >> uVar34 == 0; uVar34 = uVar34 - 1) {
      }
    }
    uVar36 = uVar36 << ((byte)(uVar34 ^ 0x3f) & 0x3f);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar36;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ac) * 8);
    auVar7 = auVar7 * auVar13;
    if ((~auVar7._8_4_ & 0x1ff) == 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar36;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = SUB168(auVar8 * auVar14,8);
      auVar7 = auVar7 + auVar18;
    }
    options = auVar7._8_8_;
    iVar23 = (((iVar46 * 0x3526a >> 0x10) - (int)(uVar34 ^ 0x3f)) - (auVar7._12_4_ >> 0x1f)) + 0x43e
    ;
    bVar26 = 9 - (auVar7[0xf] >> 7);
    uVar36 = (ulong)options >> (bVar26 & 0x3f);
    if (iVar23 < 1) {
      if (iVar23 < -0x3e) goto LAB_003a0015;
      bVar26 = 1 - (char)iVar23;
      uVar36 = (uVar36 >> (bVar26 & 0x3f)) + (ulong)((uVar36 >> ((ulong)bVar26 & 0x3f) & 1) != 0);
      uVar45 = (uint)(uVar36 >> 0x35 != 0);
      pbVar28 = (bigint *)(uVar36 >> 1);
    }
    else {
      uVar34 = uVar36 & 0xfffffffffffffe;
      if ((parse_options_t<char>)(uVar36 << (bVar26 & 0x3f)) != options || ((uint)uVar36 & 3) != 1)
      {
        uVar34 = uVar36;
      }
      if (1 < auVar7._0_8_) {
        uVar34 = uVar36;
      }
      if ((fast_float *)0x1b < (fast_float *)(local_288.exponent + 4)) {
        uVar34 = uVar36;
      }
      uVar36 = (ulong)((uint)uVar34 & 1);
      bVar47 = uVar36 + uVar34 >> 0x36 != 0;
      pbVar28 = (bigint *)((uVar34 >> 1) + (uVar36 & uVar34) & 0x7fefffffffffffff);
      if (bVar47) {
        pbVar28 = (bigint *)0x0;
      }
      options._1_7_ = 0;
      options.format._0_1_ = bVar47;
      uVar45 = iVar23 + (uint)bVar47;
      if (0x7fe < (int)uVar45) {
        uVar45 = 0x7ff;
        pbVar28 = (bigint *)0x0;
      }
    }
  }
  if ((bigmant_00 != pbVar28) || ((uint)uVar41 != uVar45)) {
    if (uVar29 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar41 = 0x3f;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar41 == 0; uVar41 = uVar41 - 1) {
      }
    }
    uVar36 = uVar29 << ((byte)(uVar41 ^ 0x3f) & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar36;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ac) * 8);
    auVar5 = auVar5 * auVar11;
    lVar38 = auVar5._8_8_;
    options = auVar5._0_8_;
    if ((~auVar5._8_4_ & 0x1ff) == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar36;
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar46 * 2 + 0x2ad) * 8);
      lVar38 = lVar38 + (ulong)CARRY8(SUB168(auVar6 * auVar12,8),(ulong)options);
    }
    uVar41 = (ulong)((((iVar46 * 0x3526a >> 0x10) - (int)(uVar41 ^ 0x3f)) - (int)(lVar38 >> 0x3f)) -
                    0x7bcd);
    bigmant_00 = (bigint *)(lVar38 << ((byte)((ulong)lVar38 >> 0x3f) ^ 1));
  }
LAB_003a01d0:
  exponent_00 = options.format;
  if ((int)uVar41 < 0) {
    uVar36 = uVar29;
    pfVar31 = (fast_float *)local_288.exponent;
    if (9999 < uVar29) {
      do {
        uVar29 = uVar36 / 10000;
        pfVar31 = (fast_float *)(ulong)((int)pfVar31 + 4);
        bVar47 = 99999999 < uVar36;
        uVar36 = uVar29;
      } while (bVar47);
    }
    uVar36 = uVar29;
    if (99 < uVar29) {
      do {
        uVar36 = uVar29 / 100;
        pfVar31 = (fast_float *)(ulong)((int)pfVar31 + 2);
        bVar47 = 9999 < uVar29;
        uVar29 = uVar36;
      } while (bVar47);
    }
    uVar45 = (uint)pfVar31;
    if (9 < uVar36) {
      do {
        uVar45 = (int)pfVar31 + 1;
        pfVar31 = (fast_float *)(ulong)uVar45;
        bVar47 = 99 < uVar36;
        uVar36 = uVar36 / 10;
      } while (bVar47);
    }
    local_230 = 0;
    memset(&local_228,0,0x1f8);
    parse_mantissa<char>(&local_228,&local_288,0x301,&local_230);
    iVar46 = (uVar45 - (int)local_230) + 1;
    if (iVar46 < 0) {
      aVar51.mantissa = (ulong)((int)uVar41 + 0x8000);
      aVar51.power2 = iVar46;
      aVar51._12_4_ = 0;
      aVar51 = negative_digit_comp<double>((fast_float *)&local_228,bigmant_00,aVar51,exponent_00);
      auVar17 = aVar51._0_12_;
    }
    else {
      aVar51 = positive_digit_comp<double>(&local_228,iVar46);
      auVar17 = aVar51._0_12_;
    }
    bigmant_00 = auVar17._0_8_;
    uVar41 = (ulong)auVar17._8_4_;
  }
  uVar27 = 0;
  if ((int)uVar41 == 0x7ff) {
    uVar27 = 0x22;
  }
  uVar30 = 0x22;
  if ((int)uVar41 != 0) {
    uVar30 = uVar27;
  }
  *(ulong *)last = (ulong)local_288.negative << 0x3f | (ulong)bigmant_00 | uVar41 << 0x34;
  if (bigmant_00 != (bigint *)0x0) {
    uVar30 = uVar27;
  }
  if (CONCAT53(local_288.mantissa._3_5_,(undefined3)local_288.mantissa) == 0) {
    uVar30 = uVar27;
  }
  fVar19.ec = uVar30;
  fVar19.ptr = (char *)uVar43;
  fVar19._12_4_ = 0;
  return fVar19;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}